

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::CheckTypeCompatibility
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZMatrix<std::complex<double>_> *A,
          TPZMatrix<std::complex<double>_> *B)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if (A == (TPZMatrix<std::complex<double>_> *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(A,&TPZMatrix<std::complex<double>>::typeinfo,
                           &TPZFYsmpMatrix<std::complex<double>>::typeinfo,0);
  }
  if (B == (TPZMatrix<std::complex<double>_> *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(B,&TPZMatrix<std::complex<double>>::typeinfo,
                           &TPZFYsmpMatrix<std::complex<double>>::typeinfo,0);
  }
  if (lVar2 == 0 || lVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "auto TPZFYsmpMatrix<std::complex<double>>::CheckTypeCompatibility(const TPZMatrix<complex<double>> *, const TPZMatrix<complex<double>> *)::(anonymous class)::operator()() const [TVar = std::complex<double>]"
               ,0xce);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nERROR: incompatible matrices\n.Aborting...\n",0x2b);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzysmp.cpp",
               0x162);
  }
  if (*(long *)(lVar2 + 0x30) < 1) {
    bVar5 = false;
  }
  else {
    lVar4 = 0;
    bVar5 = false;
    do {
      bVar1 = !bVar5;
      bVar5 = true;
      if (bVar1) {
        bVar5 = *(long *)(*(long *)(lVar2 + 0x28) + lVar4 * 8) !=
                *(long *)(*(long *)(lVar3 + 0x28) + lVar4 * 8);
      }
      lVar4 = lVar4 + 1;
    } while (*(long *)(lVar2 + 0x30) != lVar4);
  }
  if (0 < *(long *)(lVar2 + 0x50)) {
    lVar4 = 0;
    do {
      bVar1 = !bVar5;
      bVar5 = true;
      if (bVar1) {
        bVar5 = *(long *)(*(long *)(lVar2 + 0x48) + lVar4 * 8) !=
                *(long *)(*(long *)(lVar3 + 0x48) + lVar4 * 8);
      }
      lVar4 = lVar4 + 1;
    } while (*(long *)(lVar2 + 0x50) != lVar4);
  }
  if (!bVar5) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "auto TPZFYsmpMatrix<std::complex<double>>::CheckTypeCompatibility(const TPZMatrix<complex<double>> *, const TPZMatrix<complex<double>> *)::(anonymous class)::operator()() const [TVar = std::complex<double>]"
             ,0xce);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: incompatible matrices\n.Aborting...\n",0x2b);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzysmp.cpp",
             0x162);
}

Assistant:

void TPZFYsmpMatrix<TVar>::CheckTypeCompatibility(const TPZMatrix<TVar>*A,
																									const TPZMatrix<TVar>*B)const
{
  auto incompatSparse = [](){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: incompatible matrices\n.Aborting...\n";
    DebugStop();
  };
	auto aPtr = dynamic_cast<const TPZFYsmpMatrix<TVar>*>(A);
  auto bPtr = dynamic_cast<const TPZFYsmpMatrix<TVar>*>(B);
  if(!aPtr || !bPtr){
    incompatSparse();
  }
	bool check{false};
	const auto nIA = aPtr->fIA.size();
	for(auto i = 0; i < nIA; i++){
		check = check || aPtr->fIA[i] != bPtr->fIA[i];
	}

	const auto nJA = aPtr->fJA.size();
	for(auto i = 0; i < nJA; i++){
		check = check || aPtr->fJA[i] != bPtr->fJA[i];
	}
	if(check) incompatSparse();
}